

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap(MessageGenerator *this,Printer *p)

{
  byte bVar1;
  pointer ppFVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  unsigned_long uVar4;
  long *plVar5;
  ushort *puVar6;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  bool bVar10;
  FileOptions_OptimizeMode FVar11;
  int iVar12;
  CppStringType CVar13;
  pointer ppFVar14;
  pointer prVar15;
  long *plVar16;
  FieldGenerator *this_00;
  value_type pOVar17;
  value_type_conflict this_01;
  OneofDescriptor *pOVar18;
  Nonnull<const_char_*> failure_msg;
  undefined1 split;
  int iVar19;
  Options *in_RCX;
  FieldGeneratorTable *pFVar20;
  ulong uVar21;
  long lVar22;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Formatter format;
  string last_field_name;
  FieldDescriptor *field;
  string first_field_name;
  RunMap runs;
  const_iterator it;
  Iterator __begin4;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  anon_class_1_0_00000001 local_2c1;
  Formatter local_2c0;
  Printer *local_298;
  Options *local_290;
  Sub *local_288;
  string local_280;
  FileDescriptor *local_260;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
  local_238;
  iterator local_218;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  unsigned_long local_1c8;
  FieldGeneratorTable *local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [168];
  Sub local_100;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_48;
  
  local_290 = &this->options_;
  local_298 = p;
  SimpleBaseClass_abi_cxx11_
            ((string *)local_1b8,(cpp *)this->descriptor_,(Descriptor *)local_290,in_RCX);
  uVar7 = local_1b8._8_8_;
  if ((undefined1 *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
  }
  if ((slot_type *)uVar7 == (slot_type *)0x0) {
    local_2c0.printer_ = local_298;
    local_2c0.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    local_2c0.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_2c0.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    format_00._M_str =
         "void $classname$::InternalSwap($classname$* PROTOBUF_RESTRICT $nonnull$ other) {\n";
    format_00._M_len = 0x51;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_298,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&local_2c0.vars_,format_00);
    (local_2c0.printer_)->indent_ =
         (local_2c0.printer_)->indent_ + ((local_2c0.printer_)->options_).spaces_per_indent;
    format_01._M_str = "using ::std::swap;\n";
    format_01._M_len = 0x13;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_2c0.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&local_2c0.vars_,format_01);
    format_02._M_str = "$WeakDescriptorSelfPin$";
    format_02._M_len = 0x17;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_2c0.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&local_2c0.vars_,format_02);
    FVar11 = GetOptimizeFor(this->descriptor_->file_,local_290,(bool *)0x0);
    if (FVar11 == FileOptions_OptimizeMode_CODE_SIZE) {
      format_03._M_str = "GetReflection()->Swap(this, other);";
      format_03._M_len = 0x23;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (local_2c0.printer_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),&local_2c0.vars_,format_03);
    }
    else {
      if (0 < this->descriptor_->extension_range_count_) {
        format_04._M_str = "$extensions$.InternalSwap(&other->$extensions$);\n";
        format_04._M_len = 0x31;
        io::Printer::
        FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (local_2c0.printer_,
                   (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )ZEXT816(0),&local_2c0.vars_,format_04);
      }
      local_258._8_8_ = this->descriptor_;
      local_238.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = local_238.settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_ & 0xffffffff00000000;
      local_258._0_4_ = *(int *)(local_258._8_8_ + 8);
      local_238.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           local_258._8_8_;
      bVar8 = protobuf::internal::operator==((Iterator *)&local_238,(Iterator *)local_258);
      if (!bVar8) {
        do {
          this_01 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                    operator*((Iterator *)&local_238);
          if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_01->type_ * 4) == 9) &&
             ((CVar13 = FieldDescriptor::cpp_string_type(this_01), CVar13 == kString ||
              (CVar13 = FieldDescriptor::cpp_string_type(this_01), CVar13 == kView)))) {
            bVar1 = this_01->field_0x1;
            bVar10 = (bool)((bVar1 & 0x20) >> 5);
            if (0xbf < bVar1 == bVar10) {
              failure_msg = (Nonnull<const_char_*>)0x0;
            }
            else {
              failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                      (bVar10,0xbf < bVar1,
                                       "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED"
                                      );
            }
            if (failure_msg != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,failure_msg);
LAB_0025c569:
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)local_1b8);
            }
            if ((this_01->field_0x1 & 0x20) == 0) {
              if ((this_01->field_0x3 & 1) == 0) {
                bVar10 = ShouldSplit(this_01,local_290);
                if (!bVar10) break;
              }
              else {
                if ((this_01->field_0x1 & 0x10) == 0) {
                  pOVar18 = (OneofDescriptor *)0x0;
                }
                else {
                  pOVar18 = (this_01->scope_).containing_oneof;
                  if (pOVar18 == (OneofDescriptor *)0x0) {
                    iVar12 = 0xb31;
                    goto LAB_0025c5a5;
                  }
                }
                if (pOVar18 == (OneofDescriptor *)0x0) {
                  iVar12 = 0xb63;
LAB_0025c5a5:
                  protobuf::internal::protobuf_assumption_failed
                            ("res != nullptr",
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                             ,iVar12);
                }
                if ((pOVar18->field_count_ == 1) && ((pOVar18->fields_->field_0x1 & 2) != 0)) {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)local_1b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                             ,0xb64,"!res->is_synthetic()");
                  goto LAB_0025c569;
                }
              }
            }
          }
          local_238.settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ = CONCAT44(local_238.settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.capacity_._4_4_,
                               (int)local_238.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.capacity_ + 1);
          bVar8 = protobuf::internal::operator==((Iterator *)&local_238,(Iterator *)local_258);
        } while (!bVar8);
      }
      if (bVar8 == false) {
        io::Printer::Emit(local_298,0,0,0x5b,
                          "\n        auto* arena = GetArena();\n        ABSL_DCHECK_EQ(arena, other->GetArena());\n      "
                         );
      }
      format_05._M_str = "_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n";
      format_05._M_len = 0x3f;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (local_2c0.printer_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),&local_2c0.vars_,format_05);
      if (((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (local_1b8._0_8_ = (pointer)0x0, 0x3e < this->max_has_bit_index_ + 0x3eU)) {
        do {
          Formatter::operator()
                    (&local_2c0,"swap($has_bits$[$1$], other->$has_bits$[$1$]);\n",
                     (unsigned_long *)local_1b8);
          local_1b8._0_8_ = local_1b8._0_8_ + 1;
          iVar12 = this->max_has_bit_index_ + 0x1f;
          iVar19 = this->max_has_bit_index_ + 0x3e;
          if (-1 < iVar12) {
            iVar19 = iVar12;
          }
        } while ((ulong)local_1b8._0_8_ < (pointer)(long)(iVar19 >> 5));
      }
      local_1b8._8_8_ = (slot_type *)0x0;
      local_1a8._8_8_ =
           std::
           _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc:3826:36)>
           ::_M_invoke;
      local_1a8._0_8_ =
           std::
           _Function_handler<bool_(const_google::protobuf::FieldDescriptor_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc:3826:36)>
           ::_M_manager;
      local_238.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 1;
      local_238.settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      local_280._M_dataplus._M_p = (pointer)0x0;
      ppFVar14 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_1b8._0_8_ = this;
      if (ppFVar14 != ppFVar2) {
        do {
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*ppFVar14;
          local_258._0_8_ = paVar3;
          if ((code *)local_1a8._0_8_ == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar9 = (*(code *)local_1a8._8_8_)
                            (local_1b8,
                             (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>::iterator,_bool>
                              *)local_258);
          if (cVar9 == '\0') {
            local_280._M_dataplus._M_p = (pointer)0x0;
          }
          else {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              local_280._M_dataplus._M_p = (pointer)paVar3;
            }
            absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
            ::try_emplace_impl<google::protobuf::FieldDescriptor_const*const&>
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>::iterator,_bool>
                        *)local_258,&local_238,(FieldDescriptor **)&local_280);
            *(long *)(local_258._8_8_ + 8) = *(long *)(local_258._8_8_ + 8) + 1;
          }
          ppFVar14 = ppFVar14 + 1;
        } while (ppFVar14 != ppFVar2);
      }
      if ((code *)local_1a8._0_8_ != (code *)0x0) {
        (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
      }
      ppFVar14 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((this->optimized_order_).
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppFVar14) {
        local_288 = &local_100;
        pFVar20 = &this->field_generators_;
        uVar21 = 0;
        local_1c0 = pFVar20;
        do {
          split = SUB81(pFVar20,0);
          local_260 = (FileDescriptor *)ppFVar14[uVar21];
          bVar8 = ShouldSplit((FieldDescriptor *)local_260,local_290);
          if (!bVar8) {
            local_218 = absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
                        ::find<google::protobuf::FieldDescriptor_const*>
                                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
                                    *)&local_238,
                                   (key_arg<const_google::protobuf::FieldDescriptor_*> *)&local_260)
            ;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
            ::AssertNotDebugCapacity(&local_238);
            local_1b8._0_8_ = (MessageGenerator *)0x0;
            bVar8 = absl::lts_20250127::container_internal::operator==
                              (&local_218,(iterator *)local_1b8);
            if ((bVar8) ||
               (prVar15 = absl::lts_20250127::container_internal::
                          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                          ::iterator::operator->(&local_218), prVar15->second < 2)) {
              this_00 = FieldGeneratorTable::get(local_1c0,(FieldDescriptor *)local_260);
              FieldGenerator::GenerateSwappingCode(this_00,local_298);
            }
            else {
              prVar15 = absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                        ::iterator::operator->(&local_218);
              uVar4 = prVar15->second;
              FieldMemberName_abi_cxx11_
                        ((string *)local_258,(cpp *)local_260,(FieldDescriptor *)0x0,(bool)split);
              local_1c8 = uVar4;
              FieldMemberName_abi_cxx11_
                        (&local_280,
                         (cpp *)(this->optimized_order_).
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar21 + (uVar4 - 1)],
                         (FieldDescriptor *)0x0,(bool)split);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"first","");
              io::Printer::Sub::Sub<std::__cxx11::string_const&>
                        ((Sub *)local_1b8,&local_1e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258);
              local_208._0_8_ = &local_1f8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"last","");
              io::Printer::Sub::Sub<std::__cxx11::string_const&>
                        (&local_100,(string *)local_208,&local_280);
              vars.len_ = 2;
              vars.ptr_ = (pointer)local_1b8;
              io::Printer::WithDefs(&local_48,local_298,vars,false);
              lVar22 = 0x170;
              do {
                if (*(char *)((long)&local_1c0 + lVar22) == '\x01') {
                  std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                  _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                              *)(local_208 + lVar22 + 8));
                }
                plVar16 = (long *)((long)&local_218.ctrl_ + lVar22);
                plVar5 = *(long **)((long)&local_238.settings_.
                                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                           .
                                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                           .value.heap_or_soo_ + lVar22);
                if (plVar16 != plVar5) {
                  operator_delete(plVar5,*plVar16 + 1);
                }
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                  ::_S_vtable._M_arr
                  [*(byte *)((long)&local_238.settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.size_ + lVar22)]._M_data)
                          (&local_2c1,
                           (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            *)(local_258 + lVar22 + 8));
                *(undefined1 *)
                 ((long)&local_238.settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.size_ + lVar22) = 0xff;
                plVar5 = *(long **)((long)&local_280.field_2 + lVar22);
                if ((long *)((long)&local_260 + lVar22) != plVar5) {
                  operator_delete(plVar5,*(long *)((long)&local_260 + lVar22) + 1);
                }
                lVar22 = lVar22 + -0xb8;
              } while (lVar22 != 0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._0_8_ != &local_1f8) {
                operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              format_06._M_str =
                   "$pbi$::memswap<\n    PROTOBUF_FIELD_OFFSET($classname$, $last$)\n    + sizeof($classname$::$last$)\n    - PROTOBUF_FIELD_OFFSET($classname$, $first$)>(\n        reinterpret_cast<char*>(&$first$),\n        reinterpret_cast<char*>(&other->$first$));\n"
              ;
              format_06._M_len = 0xf3;
              io::Printer::
              FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                        (local_2c0.printer_,
                         (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0),&local_2c0.vars_,format_06);
              absl::lts_20250127::
              Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
              ::~Cleanup(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p != &local_280.field_2) {
                operator_delete(local_280._M_dataplus._M_p,
                                local_280.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._0_8_ != &local_248) {
                operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity + 1);
              }
              uVar21 = uVar21 + (local_1c8 - 1);
            }
          }
          uVar21 = uVar21 + 1;
          ppFVar14 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pFVar20 = (FieldGeneratorTable *)
                    ((long)(this->optimized_order_).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar14 >> 3);
        } while (uVar21 < pFVar20);
      }
      bVar8 = ShouldSplit(this->descriptor_,local_290);
      if (bVar8) {
        format_07._M_str = "swap($split$, other->$split$);\n";
        format_07._M_len = 0x1f;
        io::Printer::
        FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (local_2c0.printer_,
                   (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )ZEXT816(0),&local_2c0.vars_,format_07);
      }
      local_258._8_8_ = this->descriptor_;
      local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
      local_258._0_4_ = *(int *)(local_258._8_8_ + 0x84);
      local_1b8._8_8_ = local_258._8_8_;
      while (bVar8 = cpp::operator==((Iterator *)local_1b8,(Iterator *)local_258), !bVar8) {
        pOVar17 = OneOfRangeImpl::Iterator::operator*((Iterator *)local_1b8);
        puVar6 = (ushort *)(pOVar17->all_names_).payload_;
        local_280._M_dataplus._M_p = (pointer)(ulong)*puVar6;
        local_280._M_string_length = (long)puVar6 + ~(ulong)local_280._M_dataplus._M_p;
        Formatter::operator()
                  (&local_2c0,"swap(_impl_.$1$_, other->_impl_.$1$_);\n",
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_280);
        local_1b8._0_4_ = local_1b8._0_4_ + 1;
      }
      local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
      if (0 < this->descriptor_->real_oneof_decl_count_) {
        do {
          Formatter::operator()
                    (&local_2c0,"swap($oneof_case$[$1$], other->$oneof_case$[$1$]);\n",
                     (int *)local_1b8);
          iVar12 = local_1b8._0_4_ + 1;
          local_1b8._0_4_ = iVar12;
        } while (iVar12 < this->descriptor_->real_oneof_decl_count_);
      }
      if (this->num_weak_fields_ != 0) {
        format_08._M_str = "$weak_field_map$.UnsafeArenaSwap(&other->$weak_field_map$);\n";
        format_08._M_len = 0x3c;
        io::Printer::
        FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (local_2c0.printer_,
                   (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )ZEXT816(0),&local_2c0.vars_,format_08);
      }
      if (((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (local_1b8._0_8_ = (pointer)0x0, 0x3e < this->max_inlined_string_index_ + 0x3eU)) {
        do {
          Formatter::operator()
                    (&local_2c0,
                     "swap($inlined_string_donated_array$[$1$], other->$inlined_string_donated_array$[$1$]);\n"
                     ,(unsigned_long *)local_1b8);
          local_1b8._0_8_ = local_1b8._0_8_ + 1;
          iVar12 = this->max_inlined_string_index_ + 0x1f;
          iVar19 = this->max_inlined_string_index_ + 0x3e;
          if (-1 < iVar12) {
            iVar19 = iVar12;
          }
        } while ((ulong)local_1b8._0_8_ < (pointer)(long)(iVar19 >> 5));
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
      ::destructor_impl(&local_238);
    }
    io::Printer::Outdent(local_2c0.printer_);
    format_09._M_str = "}\n";
    format_09._M_len = 2;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_2c0.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&local_2c0.vars_,format_09);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_2c0.vars_);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSwap(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(p);

  format(
      "void $classname$::InternalSwap($classname$* PROTOBUF_RESTRICT "
      "$nonnull$ other) {\n");
  format.Indent();
  format("using ::std::swap;\n");
  format("$WeakDescriptorSelfPin$");

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    if (descriptor_->extension_range_count() > 0) {
      format(
          "$extensions$.InternalSwap(&other->$extensions$);"
          "\n");
    }

    if (HasNonSplitOptionalString(descriptor_, options_)) {
      p->Emit(R"cc(
        auto* arena = GetArena();
        ABSL_DCHECK_EQ(arena, other->GetArena());
      )cc");
    }
    format("_internal_metadata_.InternalSwap(&other->_internal_metadata_);\n");

    if (!has_bit_indices_.empty()) {
      for (size_t i = 0; i < HasBitsSize(); ++i) {
        format("swap($has_bits$[$1$], other->$has_bits$[$1$]);\n", i);
      }
    }

    // If possible, we swap several fields at once, including padding.
    const RunMap runs =
        FindRuns(optimized_order_, [this](const FieldDescriptor* field) {
          return !ShouldSplit(field, options_) &&
                 HasTrivialSwap(field, options_, scc_analyzer_);
        });

    for (size_t i = 0; i < optimized_order_.size(); ++i) {
      const FieldDescriptor* field = optimized_order_[i];
      if (ShouldSplit(field, options_)) {
        continue;
      }
      const auto it = runs.find(field);

      // We only apply the memswap technique to runs of more than one field, as
      // `swap(field_, other.field_)` is better than
      // `memswap<...>(&field_, &other.field_)` for generated code readability.
      if (it != runs.end() && it->second > 1) {
        // Use a memswap, then skip run_length fields.
        const size_t run_length = it->second;
        const std::string first_field_name =
            FieldMemberName(field, /*split=*/false);
        const std::string last_field_name = FieldMemberName(
            optimized_order_[i + run_length - 1], /*split=*/false);

        auto v = p->WithVars({
            {"first", first_field_name},
            {"last", last_field_name},
        });

        format(
            "$pbi$::memswap<\n"
            "    PROTOBUF_FIELD_OFFSET($classname$, $last$)\n"
            "    + sizeof($classname$::$last$)\n"
            "    - PROTOBUF_FIELD_OFFSET($classname$, $first$)>(\n"
            "        reinterpret_cast<char*>(&$first$),\n"
            "        reinterpret_cast<char*>(&other->$first$));\n");

        i += run_length - 1;
        // ++i at the top of the loop.
      } else {
        field_generators_.get(field).GenerateSwappingCode(p);
      }
    }
    if (ShouldSplit(descriptor_, options_)) {
      format("swap($split$, other->$split$);\n");
    }

    for (auto oneof : OneOfRange(descriptor_)) {
      format("swap(_impl_.$1$_, other->_impl_.$1$_);\n", oneof->name());
    }

    for (int i = 0; i < descriptor_->real_oneof_decl_count(); ++i) {
      format("swap($oneof_case$[$1$], other->$oneof_case$[$1$]);\n", i);
    }

    if (num_weak_fields_) {
      format(
          "$weak_field_map$.UnsafeArenaSwap(&other->$weak_field_map$)"
          ";\n");
    }

    if (!inlined_string_indices_.empty()) {
      for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
        format(
            "swap($inlined_string_donated_array$[$1$], "
            "other->$inlined_string_donated_array$[$1$]);\n",
            i);
      }
    }
  } else {
    format("GetReflection()->Swap(this, other);");
  }

  format.Outdent();
  format("}\n");
}